

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O1

void __thiscall
testing::internal::
ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
::~ThreadLocal(ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
               *this)

{
  ValueHolderFactory *pVVar1;
  int iVar2;
  long *plVar3;
  GTestLog local_14;
  
  plVar3 = (long *)pthread_getspecific(this->key_);
  if (plVar3 != (long *)0x0) {
    (**(code **)(*plVar3 + 8))(plVar3);
  }
  iVar2 = pthread_key_delete(this->key_);
  if (iVar2 != 0) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/googletest/googletest/include/gtest/internal/gtest-port.h"
                       ,0x886);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"pthread_key_delete(key_)",0x18);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"failed with error ",0x12);
    std::ostream::operator<<((ostream *)&std::cerr,iVar2);
    GTestLog::~GTestLog(&local_14);
  }
  pVVar1 = (this->default_factory_).ptr_;
  if (pVVar1 != (ValueHolderFactory *)0x0) {
    (*pVVar1->_vptr_ValueHolderFactory[1])();
    (this->default_factory_).ptr_ = (ValueHolderFactory *)0x0;
  }
  return;
}

Assistant:

~ThreadLocal() {
    // Destroys the managed object for the current thread, if any.
    DeleteThreadLocalValue(pthread_getspecific(key_));

    // Releases resources associated with the key.  This will *not*
    // delete managed objects for other threads.
    GTEST_CHECK_POSIX_SUCCESS_(pthread_key_delete(key_));
  }